

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O3

void Wlc_NtkPrintConflict(Wlc_Ntk_t *p,Vec_Int_t *vTrace)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  
  puts("Memory semantics failure trace:");
  if (0 < vTrace->nSize) {
    uVar3 = 0;
    do {
      uVar1 = vTrace->pArray[uVar3];
      pcVar2 = Wlc_ObjName(p,(int)uVar1 >> 0xb);
      printf("%3d: entry %9d : obj %5d with name %16s in frame %d\n",uVar3 & 0xffffffff,(ulong)uVar1
             ,(ulong)(uint)((int)uVar1 >> 0xb),pcVar2,(ulong)(uVar1 >> 1 & 0x3ff));
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)vTrace->nSize);
  }
  return;
}

Assistant:

void Wlc_NtkPrintConflict( Wlc_Ntk_t * p, Vec_Int_t * vTrace )
{
    int Entry, i;
    printf( "Memory semantics failure trace:\n" );
    Vec_IntForEachEntry( vTrace, Entry, i )
        printf( "%3d: entry %9d : obj %5d with name %16s in frame %d\n", i, Entry, Entry >> 11, Wlc_ObjName(p, Entry>>11), (Entry >> 1) & 0x3FF );
}